

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O1

matrix_type * __thiscall
Disa::Matrix_Dense<double,2ul,2ul>::operator-=
          (Matrix_Dense<double,2ul,2ul> *this,Matrix_Dense<double,_0UL,_0UL> *matrix)

{
  pointer pVVar1;
  pointer pVVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  source_location *location;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  unsigned_long __val;
  long lVar6;
  Matrix_Dense<double,2ul,2ul> *this_00;
  bool bVar7;
  size_type *local_1d8;
  size_type local_1d0;
  size_type local_1c8;
  undefined8 uStack_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pVVar1 = (matrix->
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ).
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (matrix->
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ).
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar1 == pVVar2) {
    bVar7 = false;
  }
  else {
    bVar7 = (long)(pVVar1->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pVVar1->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x10;
  }
  location = (source_location *)((long)pVVar2 - (long)pVVar1);
  if ((location == (source_location *)0x30) && (bVar7)) {
    lVar6 = 0;
    this_00 = this;
    do {
      Vector_Dense<double,2ul>::operator-=
                ((Vector_Dense<double,2ul> *)this_00,
                 (Vector_Dense<double,_0UL> *)
                 ((long)&(((matrix->
                           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                           ).
                           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<double,_std::allocator<double>_>).
                         super__Vector_base<double,_std::allocator<double>_> + lVar6));
      lVar6 = lVar6 + 0x18;
      this_00 = (Matrix_Dense<double,2ul,2ul> *)((Vector_Dense<double,2ul> *)this_00 + 0x10);
    } while (lVar6 == 0x18);
    return (matrix_type *)this;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_58 = &PTR_s__workspace_llm4binary_github_lic_00185330;
  console_format_abi_cxx11_(&local_50,(Disa *)0x0,(Log_Level)&local_58,location);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__cxx11::to_string(&local_f8,2);
  std::operator+(&local_d8,"Incompatible matrix dimensions, ",&local_f8);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d8,",");
  local_1b8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p == paVar5) {
    local_1b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_1b8._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string(&local_118,2);
  std::operator+(&local_b8,&local_1b8,&local_118);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_b8," vs. ");
  local_198._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p == paVar5) {
    local_198.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_198._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string
            (&local_138,
             ((long)(matrix->
                    super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                    ).
                    super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(matrix->
                    super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                    ).
                    super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  std::operator+(&local_98,&local_198,&local_138);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_98,",");
  local_178._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p == paVar5) {
    local_178.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  }
  else {
    local_178.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_178._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  pVVar1 = (matrix->
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ).
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 == (matrix->
                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ).
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    __val = 0;
  }
  else {
    __val = (long)(pVVar1->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pVVar1->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
  }
  std::__cxx11::to_string(&local_158,__val);
  std::operator+(&local_78,&local_178,&local_158);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_78,".");
  local_1d8 = (size_type *)(pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8 == paVar5) {
    local_1c8 = paVar5->_M_allocated_capacity;
    uStack_1c0 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = paVar5->_M_allocated_capacity;
  }
  local_1d0 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1d8,local_1d0);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_50);
  exit(1);
}

Assistant:

constexpr matrix_type& operator-=(const Matrix_Dense<_type, _row_other, _col_other>& matrix) {
    ASSERT_DEBUG(size() == matrix.size(), "Incompatible matrix dimensions, " + std::to_string(size_row()) + "," +
                                          std::to_string(size_column()) + " vs. " + std::to_string(matrix.size_row()) +
                                          "," + std::to_string(matrix.size_column()) + ".");
    FOR(row, _row)(*this)[row] -= matrix[row];
    return *this;
  }